

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

void init_ts_info(TCGContext_conflict9 *tcg_ctx,tcg_temp_info *infos,TCGTempSet *temps_used,
                 TCGTemp *ts)

{
  ulong uVar1;
  
  uVar1 = ((long)ts + (-0x388 - (long)tcg_ctx)) / 0x38;
  if ((temps_used->l[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) != 0) {
    return;
  }
  ts->state_ptr = infos + uVar1;
  infos[uVar1].next_copy = ts;
  infos[uVar1].prev_copy = ts;
  infos[uVar1].is_const = false;
  infos[uVar1].mask = 0xffffffffffffffff;
  temps_used->l[uVar1 >> 6] = temps_used->l[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
  return;
}

Assistant:

static void init_ts_info(TCGContext *tcg_ctx, struct tcg_temp_info *infos,
                         TCGTempSet *temps_used, TCGTemp *ts)
{
    size_t idx = temp_idx(tcg_ctx, ts);
    if (!test_bit(idx, temps_used->l)) {
        struct tcg_temp_info *ti = &infos[idx];

        ts->state_ptr = ti;
        ti->next_copy = ts;
        ti->prev_copy = ts;
        ti->is_const = false;
        ti->mask = -1;
        set_bit(idx, temps_used->l);
    }
}